

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joypad.c
# Opt level: O2

void joypad_truncate_to(JoypadBuffer *buffer,JoypadStateIter iter)

{
  JoypadBuffer *pJVar1;
  JoypadChunk *pJVar2;
  JoypadBuffer *__ptr;
  JoypadButtons local_48;
  
  pJVar2 = iter.chunk;
  pJVar2->size = ((long)iter.state - (long)pJVar2->data >> 4) + 1;
  __ptr = (JoypadBuffer *)pJVar2->next;
  while (__ptr != buffer) {
    pJVar1 = (JoypadBuffer *)(__ptr->sentinel).next;
    free((__ptr->sentinel).data);
    free(__ptr);
    __ptr = pJVar1;
  }
  pJVar2->next = &buffer->sentinel;
  (buffer->sentinel).prev = pJVar2;
  joypad_unpack_buttons(&local_48,(iter.state)->buttons);
  (buffer->last_buttons).start = local_48.start;
  (buffer->last_buttons).select = local_48.select;
  (buffer->last_buttons).B = local_48.B;
  (buffer->last_buttons).A = local_48.A;
  (buffer->last_buttons).down = local_48.down;
  (buffer->last_buttons).up = local_48.up;
  (buffer->last_buttons).left = local_48.left;
  (buffer->last_buttons).right = local_48.right;
  return;
}

Assistant:

void joypad_truncate_to(JoypadBuffer* buffer, JoypadStateIter iter) {
  size_t index = iter.state - iter.chunk->data;
  iter.chunk->size = index + 1;
  JoypadChunk* chunk = iter.chunk->next;
  JoypadChunk* sentinel = &buffer->sentinel;
  while (chunk != sentinel) {
    JoypadChunk* temp = chunk->next;
    xfree(chunk->data);
    xfree(chunk);
    chunk = temp;
  }
  iter.chunk->next = sentinel;
  sentinel->prev = iter.chunk;
  buffer->last_buttons = joypad_unpack_buttons(iter.state->buttons);
}